

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

KeywordCategory duckdb::ToKeywordCategory(PGKeywordCategory type)

{
  string *msg;
  undefined1 in_DIL;
  allocator *this;
  allocator local_29;
  string local_28 [39];
  KeywordCategory local_1;
  
  switch(in_DIL) {
  case 0:
    local_1 = KEYWORD_UNRESERVED;
    break;
  case 1:
    local_1 = KEYWORD_COL_NAME;
    break;
  case 2:
    local_1 = KEYWORD_TYPE_FUNC;
    break;
  case 3:
    local_1 = KEYWORD_RESERVED;
    break;
  case 4:
    local_1 = KEYWORD_NONE;
    break;
  default:
    msg = (string *)__cxa_allocate_exception(0x10);
    this = &local_29;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_28,"Unrecognized keyword category",this);
    InternalException::InternalException((InternalException *)this,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return local_1;
}

Assistant:

KeywordCategory ToKeywordCategory(duckdb_libpgquery::PGKeywordCategory type) {
	switch (type) {
	case duckdb_libpgquery::PGKeywordCategory::PG_KEYWORD_RESERVED:
		return KeywordCategory::KEYWORD_RESERVED;
	case duckdb_libpgquery::PGKeywordCategory::PG_KEYWORD_UNRESERVED:
		return KeywordCategory::KEYWORD_UNRESERVED;
	case duckdb_libpgquery::PGKeywordCategory::PG_KEYWORD_TYPE_FUNC:
		return KeywordCategory::KEYWORD_TYPE_FUNC;
	case duckdb_libpgquery::PGKeywordCategory::PG_KEYWORD_COL_NAME:
		return KeywordCategory::KEYWORD_COL_NAME;
	case duckdb_libpgquery::PGKeywordCategory::PG_KEYWORD_NONE:
		return KeywordCategory::KEYWORD_NONE;
	default:
		throw InternalException("Unrecognized keyword category");
	}
}